

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

uint128 __thiscall
absl::anon_unknown_0::SafeMultiply<absl::uint128>::operator()
          (SafeMultiply<absl::uint128> *this,uint128 a,uint128 b)

{
  uint128 rhs;
  uint128 lhs;
  uint128 rhs_00;
  uint128 lhs_00;
  uint128 lhs_01;
  uint128 lhs_02;
  uint128 rhs_01;
  uint128 lhs_03;
  uint128 v;
  uint128 v_00;
  uint128 v_01;
  uint128 v_02;
  bool bVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t extraout_RDX;
  uint128 uVar4;
  uint128 v_03;
  uint128 local_e8;
  SafeMultiply<absl::uint128> *local_d8;
  uint64_t local_d0;
  SafeMultiply<absl::uint128> *local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  SafeMultiply<absl::uint128> *local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  SafeMultiply<absl::uint128> *local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  absl *local_58;
  uint64_t local_50;
  SafeMultiply<absl::uint128> *local_40;
  SafeMultiply<absl::uint128> *this_local;
  uint128 b_local;
  uint128 a_local;
  uint64_t local_10;
  
  local_50 = b.hi_;
  local_58 = (absl *)b.lo_;
  uVar4.hi_ = a.hi_;
  b_local.hi_ = a.lo_;
  uVar4.lo_ = local_50;
  local_40 = this;
  this_local = (SafeMultiply<absl::uint128> *)local_58;
  b_local.lo_ = local_50;
  a_local.lo_ = uVar4.hi_;
  uVar2 = Uint128High64(local_58,uVar4);
  if (uVar2 != 0) {
    __assert_fail("Uint128High64(b) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/time/duration.cc"
                  ,0xde,
                  "uint128 absl::(anonymous namespace)::SafeMultiply<absl::uint128>::operator()(uint128, uint128) const [Ignored = absl::uint128]"
                 );
  }
  local_68 = b_local.hi_;
  local_60 = a_local.lo_;
  v_03.hi_ = extraout_RDX;
  v_03.lo_ = a_local.lo_;
  uVar2 = Uint128High64((absl *)b_local.hi_,v_03);
  if (uVar2 == 0) {
    local_78 = b_local.hi_;
    local_70 = a_local.lo_;
    v_02.hi_ = a_local.lo_;
    v_02.lo_ = b_local.hi_;
    uVar2 = Uint128Low64(v_02);
    local_88 = this_local;
    local_80 = b_local.lo_;
    v_01.hi_ = b_local.lo_;
    v_01.lo_ = (uint64_t)this_local;
    uVar3 = Uint128Low64(v_01);
    if ((uVar2 | uVar3) >> 0x20 == 0) {
      local_98 = b_local.hi_;
      local_90 = a_local.lo_;
      v_00.hi_ = a_local.lo_;
      v_00.lo_ = b_local.hi_;
      uVar2 = Uint128Low64(v_00);
      local_a8 = this_local;
      local_a0 = b_local.lo_;
      v.hi_ = b_local.lo_;
      v.lo_ = (uint64_t)this_local;
      uVar3 = Uint128Low64(v);
      uint128::uint128((uint128 *)&a_local.hi_,uVar2 * uVar3);
    }
    else {
      local_b8 = b_local.hi_;
      local_b0 = a_local.lo_;
      local_c8 = this_local;
      local_c0 = b_local.lo_;
      lhs_03.hi_ = a_local.lo_;
      lhs_03.lo_ = b_local.hi_;
      rhs_01.hi_ = b_local.lo_;
      rhs_01.lo_ = (uint64_t)this_local;
      join_0x00000010_0x00000000_ = absl::operator*(lhs_03,rhs_01);
    }
  }
  else {
    local_d8 = this_local;
    local_d0 = b_local.lo_;
    uint128::uint128(&local_e8,0);
    lhs_02.hi_ = local_d0;
    lhs_02.lo_ = (uint64_t)local_d8;
    bVar1 = absl::operator==(lhs_02,local_e8);
    uVar3 = a_local.lo_;
    uVar2 = b_local.hi_;
    if (bVar1) {
      local_10 = b_local.lo_;
      a_local.hi_ = (uint64_t)this_local;
    }
    else {
      lhs_00.hi_ = 0xffffffffffffffff;
      lhs_00.lo_ = 0xffffffffffffffff;
      rhs_00.hi_ = b_local.lo_;
      rhs_00.lo_ = (uint64_t)this_local;
      uVar4 = operator/(lhs_00,rhs_00);
      lhs_01.hi_ = uVar3;
      lhs_01.lo_ = uVar2;
      bVar1 = operator>(lhs_01,uVar4);
      if (bVar1) {
        local_10 = 0xffffffffffffffff;
        a_local.hi_ = 0xffffffffffffffff;
      }
      else {
        lhs.hi_ = a_local.lo_;
        lhs.lo_ = b_local.hi_;
        rhs.hi_ = b_local.lo_;
        rhs.lo_ = (uint64_t)this_local;
        join_0x00000010_0x00000000_ = absl::operator*(lhs,rhs);
      }
    }
  }
  return stack0xffffffffffffffe8;
}

Assistant:

uint128 operator()(uint128 a, uint128 b) const {
    // b hi is always zero because it originated as an int64_t.
    assert(Uint128High64(b) == 0);
    // Fastpath to avoid the expensive overflow check with division.
    if (Uint128High64(a) == 0) {
      return (((Uint128Low64(a) | Uint128Low64(b)) >> 32) == 0)
                 ? static_cast<uint128>(Uint128Low64(a) * Uint128Low64(b))
                 : a * b;
    }
    return b == 0 ? b : (a > kuint128max / b) ? kuint128max : a * b;
  }